

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O1

uhugeint_t
duckdb::VectorTryCastOperator<duckdb::NumericTryCast>::Operation<unsigned_int,duckdb::uhugeint_t>
          (uint input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  uint input_00;
  uhugeint_t output;
  uhugeint_t local_58;
  string local_48;
  
  bVar1 = Uhugeint::TryConvert<unsigned_int>(input,&local_58);
  if (!bVar1) {
    CastExceptionText<unsigned_int,duckdb::uhugeint_t>(&local_48,(duckdb *)(ulong)input,input_00);
    local_58 = HandleVectorCastError::Operation<duckdb::uhugeint_t>
                         (&local_48,mask,idx,(VectorTryCastData *)dataptr);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  return local_58;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output))) {
			return output;
		}
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}